

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t validation_layer::logAndPropagateResult(char *fname,ze_result_t result)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  ze_result_t in_EDX;
  ulong uVar6;
  allocator local_e9;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  string local_48;
  
  if (result == ZE_RESULT_SUCCESS) {
    return ZE_RESULT_SUCCESS;
  }
  lVar1 = *(long *)(context + 0xd50);
  loader::to_string_abi_cxx11_(&local_48,(loader *)(ulong)result,in_EDX);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x1a92bf);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_b8 = *puVar5;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar5;
    local_c8 = (ulong *)*plVar2;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::string((string *)&local_a8,fname,&local_e9);
  uVar6 = 0xf;
  if (local_c8 != &local_b8) {
    uVar6 = local_b8;
  }
  if (uVar6 < (ulong)(local_a0 + local_c0)) {
    uVar6 = 0xf;
    if (local_a8 != local_98) {
      uVar6 = local_98[0];
    }
    if ((ulong)(local_a0 + local_c0) <= uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8);
      goto LAB_001743ca;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8);
LAB_001743ca:
  local_e8 = &local_d8;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_d8 = *plVar2;
    uStack_d0 = puVar3[3];
  }
  else {
    local_d8 = *plVar2;
    local_e8 = (long *)*puVar3;
  }
  local_e0 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  if (*(char *)(lVar1 + 1) == '\x01') {
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    spdlog::logger::log(*(logger **)(lVar1 + 8),0.0);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return result;
}

Assistant:

static ze_result_t logAndPropagateResult(const char* fname, ze_result_t result) {
        if (result != ZE_RESULT_SUCCESS) {
            context.logger->log_trace("Error (" + loader::to_string(result) + ") in " + std::string(fname));
        }
        return result;
    }